

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

void box_printf(char *fmt,...)

{
  char in_AL;
  size_t sVar1;
  long lVar2;
  ostream *poVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list marker;
  char buffer [160];
  undefined8 local_188;
  void **local_180;
  undefined1 *local_178;
  char local_168 [160];
  undefined1 local_c8 [8];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_c0 = in_RSI;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  memset(local_168,0,0xa0);
  std::operator<<((ostream *)&std::cerr,anon_var_dwarf_17e3b);
  local_188 = 0x3000000008;
  local_180 = &marker[0].overflow_arg_area;
  local_178 = local_c8;
  vsprintf(local_168,fmt,&local_188);
  sVar1 = strlen(local_168);
  for (lVar2 = (long)(int)sVar1; lVar2 < 0x49; lVar2 = lVar2 + 1) {
    local_168[lVar2] = ' ';
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,local_168);
  std::operator<<(poVar3,anon_var_dwarf_17e51);
  return;
}

Assistant:

void box_printf(char const* fmt, ...)
{
    va_list marker;
    char buffer[160]{0};
    int len, i;

    std::cerr << "║ ";

    va_start(marker,fmt);
    vsprintf(buffer,fmt,marker);
    va_end(marker);
    len = strlen(buffer);

    for( i = len; i < 73; i++ )
       buffer[i] = ' ';

    std::cerr << buffer << "║\n";
}